

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

void reader_init(FileReader *reader,char *file_in,MppCodingType type)

{
  FILE *__stream;
  undefined8 *data;
  long lVar1;
  undefined8 uVar2;
  FileReaderImpl *impl;
  FILE *fp_input;
  MppCodingType type_local;
  char *file_in_local;
  FileReader *reader_local;
  
  __stream = fopen(file_in,"rb");
  if (__stream == (FILE *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","failed to open input file %s\n",0,file_in);
    *reader = (FileReader)0x0;
  }
  else {
    data = (undefined8 *)mpp_osal_calloc("reader_init",0x78);
    if ((data == (undefined8 *)0x0) &&
       (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","reader_init",0x14a),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    *data = __stream;
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    data[1] = lVar1;
    fseek(__stream,0,0);
    check_file_type(data,file_in,type);
    uVar2 = mpp_osal_calloc("reader_init",(ulong)*(uint *)((long)data + 100) << 3);
    data[0xe] = uVar2;
    reader_start(data);
    *reader = data;
  }
  return;
}

Assistant:

void reader_init(FileReader* reader, char* file_in, MppCodingType type)
{
    FILE *fp_input = fopen(file_in, "rb");
    FileReaderImpl *impl = NULL;

    if (!fp_input) {
        mpp_err("failed to open input file %s\n", file_in);
        *reader = NULL;
        return;
    }

    impl = mpp_calloc(FileReaderImpl, 1);
    mpp_assert(impl);

    impl->fp_input = fp_input;
    fseek(fp_input, 0L, SEEK_END);
    impl->file_size = ftell(fp_input);
    fseek(fp_input, 0L, SEEK_SET);

    check_file_type(impl, file_in, type);

    impl->slots = mpp_calloc(FileBufSlot*, impl->slot_max);

    reader_start(impl);

    *reader = impl;
}